

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O3

void Lpk_MapSuppPrintSet(Lpk_Set_t *pSet,int i)

{
  uint uSupport;
  undefined4 in_register_00000034;
  
  uSupport = pSet->uSubset1 | pSet->uSubset0;
  printf("%2d : ",CONCAT44(in_register_00000034,i));
  printf("Var = %c  ",(ulong)((int)pSet->iVar + 0x61));
  printf("Size = %2d  ",(ulong)(uint)(int)pSet->Size);
  printf("Over = %2d  ",(ulong)(uint)(int)pSet->Over);
  printf("SRed = %2d  ",(ulong)(uint)(int)pSet->SRed);
  Lpk_PrintSetOne(uSupport);
  printf("              ");
  Lpk_PrintSetOne(uSupport >> 0x10);
  putchar(10);
  return;
}

Assistant:

void Lpk_MapSuppPrintSet( Lpk_Set_t * pSet, int i )
{
    unsigned Entry;
    Entry = pSet->uSubset0 | pSet->uSubset1;
    printf( "%2d : ", i );
    printf( "Var = %c  ",  'a' + pSet->iVar );
    printf( "Size = %2d  ", pSet->Size );
    printf( "Over = %2d  ", pSet->Over );
    printf( "SRed = %2d  ", pSet->SRed );
    Lpk_PrintSetOne( Entry );
    printf( "              " );
    Lpk_PrintSetOne( Entry >> 16 );
    printf( "\n" );
}